

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O0

int mbedtls_net_connect(mbedtls_net_context *ctx,char *host,char *port,int proto)

{
  int iVar1;
  addrinfo *local_70;
  addrinfo *cur;
  addrinfo *addr_list;
  addrinfo hints;
  int ret;
  int proto_local;
  char *port_local;
  char *host_local;
  mbedtls_net_context *ctx_local;
  
  hints.ai_next._4_4_ = proto;
  hints.ai_next._0_4_ = net_prepare();
  ctx_local._4_4_ = (int)hints.ai_next;
  if ((int)hints.ai_next == 0) {
    memset(&addr_list,0,0x30);
    addr_list._4_4_ = 0;
    hints.ai_flags = 1;
    if (hints.ai_next._4_4_ == 1) {
      hints.ai_flags = 2;
    }
    hints.ai_family = 6;
    if (hints.ai_next._4_4_ == 1) {
      hints.ai_family = 0x11;
    }
    iVar1 = getaddrinfo(host,port,(addrinfo *)&addr_list,(addrinfo **)&cur);
    if (iVar1 == 0) {
      hints.ai_next._0_4_ = -0x52;
      for (local_70 = cur; local_70 != (addrinfo *)0x0; local_70 = local_70->ai_next) {
        iVar1 = socket(local_70->ai_family,local_70->ai_socktype,local_70->ai_protocol);
        ctx->fd = iVar1;
        if (ctx->fd < 0) {
          hints.ai_next._0_4_ = -0x42;
        }
        else {
          iVar1 = connect(ctx->fd,(sockaddr *)local_70->ai_addr,local_70->ai_addrlen);
          if (iVar1 == 0) {
            hints.ai_next._0_4_ = 0;
            break;
          }
          close(ctx->fd);
          hints.ai_next._0_4_ = -0x44;
        }
      }
      freeaddrinfo((addrinfo *)cur);
      ctx_local._4_4_ = (int)hints.ai_next;
    }
    else {
      ctx_local._4_4_ = -0x52;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_net_connect( mbedtls_net_context *ctx, const char *host,
                         const char *port, int proto )
{
    int ret;
    struct addrinfo hints, *addr_list, *cur;

    if( ( ret = net_prepare() ) != 0 )
        return( ret );

    /* Do name resolution with both IPv6 and IPv4 */
    memset( &hints, 0, sizeof( hints ) );
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = proto == MBEDTLS_NET_PROTO_UDP ? SOCK_DGRAM : SOCK_STREAM;
    hints.ai_protocol = proto == MBEDTLS_NET_PROTO_UDP ? IPPROTO_UDP : IPPROTO_TCP;

    if( getaddrinfo( host, port, &hints, &addr_list ) != 0 )
        return( MBEDTLS_ERR_NET_UNKNOWN_HOST );

    /* Try the sockaddrs until a connection succeeds */
    ret = MBEDTLS_ERR_NET_UNKNOWN_HOST;
    for( cur = addr_list; cur != NULL; cur = cur->ai_next )
    {
        ctx->fd = (int) socket( cur->ai_family, cur->ai_socktype,
                            cur->ai_protocol );
        if( ctx->fd < 0 )
        {
            ret = MBEDTLS_ERR_NET_SOCKET_FAILED;
            continue;
        }

        if( connect( ctx->fd, cur->ai_addr, MSVC_INT_CAST cur->ai_addrlen ) == 0 )
        {
            ret = 0;
            break;
        }

        close( ctx->fd );
        ret = MBEDTLS_ERR_NET_CONNECT_FAILED;
    }

    freeaddrinfo( addr_list );

    return( ret );
}